

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

int Abc_CascadeExperiment
              (char *pFileGeneric,DdManager *dd,DdNode **pOutputs,int nInputs,int nOutputs,
              int nLutSize,int fCheck,int fVerbose)

{
  uint uVar1;
  uint nNames;
  int iVar2;
  size_t sVar3;
  DdNode *pDVar4;
  char *pcVar5;
  abctime aVar6;
  abctime aVar7;
  Abc_Frame_t *pAbc;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  char FileNameFin [100];
  char FileNameIni [100];
  char Buffer [100];
  char Command [300];
  char *pNames [1024];
  DdNode *pbVarsEnc [1024];
  
  strcpy(FileNameIni,pFileGeneric);
  sVar3 = strlen(FileNameIni);
  builtin_strncpy(FileNameIni + sVar3,"_ENC.blif",10);
  strcpy(FileNameFin,pFileGeneric);
  sVar3 = strlen(FileNameFin);
  builtin_strncpy(FileNameFin + sVar3,"_LUT.blif",10);
  uVar1 = Abc_Base2Log(nOutputs);
  uVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pDVar4 = Cudd_bddNewVarAtLevel(dd,(int)uVar10);
    pbVarsEnc[uVar10] = pDVar4;
  }
  uVar9 = 0;
  if (0 < nInputs) {
    uVar9 = (ulong)(uint)nInputs;
  }
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    sprintf(Buffer,"pi%03d",uVar10 & 0xffffffff);
    pcVar5 = Extra_UtilStrsav(Buffer);
    pNames[uVar10] = pcVar5;
  }
  nNames = uVar1 + nInputs;
  for (; (long)uVar9 < (long)(int)nNames; uVar9 = uVar9 + 1) {
    sprintf(Buffer,"OutEnc_%02d",(ulong)(uint)((int)uVar9 - nInputs));
    pcVar5 = Extra_UtilStrsav(Buffer);
    pNames[uVar9] = pcVar5;
  }
  Abc_Clock();
  pDVar4 = GetSingleOutputFunction(dd,pOutputs,nOutputs,pbVarsEnc,uVar1,fVerbose);
  Cudd_Ref(pDVar4);
  aVar6 = Abc_Clock();
  iVar8 = 1;
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,1);
  pcVar5 = (char *)dd;
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,1);
  if (fVerbose != 0) {
    uVar1 = Cudd_DagSize(pDVar4);
    printf("MTBDD reordered = %6d nodes\n",(ulong)uVar1);
    aVar7 = Abc_Clock();
    pcVar5 = "Variable reordering time = %.2f sec\n";
    printf("Variable reordering time = %.2f sec\n",(double)((float)(aVar7 - aVar6) / 1e+06));
  }
  Abc_Clock();
  if (fCheck != 0) {
    WriteSingleOutputFunctionBlif((DdManager *)pcVar5,pDVar4,pNames,nNames,FileNameIni);
  }
  iVar2 = CreateDecomposedNetwork(dd,pDVar4,pNames,nNames,FileNameFin,nLutSize,fCheck,fVerbose);
  if (iVar2 == 0) {
    iVar8 = 0;
  }
  else {
    if (fCheck != 0) {
      sprintf(Command,"cec %s %s",FileNameIni,FileNameFin);
      pAbc = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAbc,Command);
    }
    Cudd_RecursiveDeref(dd,pDVar4);
    uVar10 = 0;
    uVar9 = (ulong)nNames;
    if ((int)nNames < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      if (pNames[uVar10] != (char *)0x0) {
        free(pNames[uVar10]);
        pNames[uVar10] = (char *)0x0;
      }
    }
  }
  return iVar8;
}

Assistant:

int Abc_CascadeExperiment( char * pFileGeneric, DdManager * dd, DdNode ** pOutputs, int nInputs, int nOutputs, int nLutSize, int fCheck, int fVerbose )
{
    int i;
    int nVars = nInputs;
    int nOuts = nOutputs;
    abctime clk1;

    int      nVarsEnc;              // the number of additional variables to encode outputs
    DdNode * pbVarsEnc[MAXOUTPUTS]; // the BDDs of the encoding vars

    int      nNames;               // the total number of all inputs
    char *   pNames[MAXINPUTS];     // the temporary storage for the input (and output encoding) names

    DdNode * aFunc;                 // the encoded 0-1 BDD containing all the outputs

    char FileNameIni[100];
    char FileNameFin[100];
    char Buffer[100];

    
//pTable = fopen( "stats.txt", "a+" );
//fprintf( pTable, "%s ", pFileGeneric );
//fprintf( pTable, "%d ", nVars );
//fprintf( pTable, "%d ", nOuts );


    // assign the file names
    strcpy( FileNameIni, pFileGeneric );
    strcat( FileNameIni, "_ENC.blif" );

    strcpy( FileNameFin, pFileGeneric );
    strcat( FileNameFin, "_LUT.blif" );


    // create the variables to encode the outputs
    nVarsEnc = Abc_Base2Log( nOuts );
    for ( i = 0; i < nVarsEnc; i++ )
        pbVarsEnc[i] = Cudd_bddNewVarAtLevel( dd, i );


    // store the input names
    nNames  = nVars + nVarsEnc;
    for ( i = 0; i < nVars; i++ )
    {
//      pNames[i] = Extra_UtilStrsav( pFunc->pInputNames[i] );
        sprintf( Buffer, "pi%03d", i );
        pNames[i] = Extra_UtilStrsav( Buffer );
    }
    // set the encoding variable name
    for ( ; i < nNames; i++ )
    {       
        sprintf( Buffer, "OutEnc_%02d", i-nVars );
        pNames[i] = Extra_UtilStrsav( Buffer );
    }


    // print the variable order
//  printf( "\n" );
//  printf( "Variable order is: " );
//  for ( i = 0; i < dd->size; i++ )
//      printf( " %d", dd->invperm[i] );
//  printf( "\n" );

    // derive the single-output function
    clk1 = Abc_Clock();
    aFunc = GetSingleOutputFunction( dd, pOutputs, nOuts, pbVarsEnc, nVarsEnc, fVerbose );  Cudd_Ref( aFunc );
//  aFunc = GetSingleOutputFunctionRemapped( dd, pOutputs, nOuts, pbVarsEnc, nVarsEnc );  Cudd_Ref( aFunc );
//  if ( fVerbose )
//  printf( "Single-output function computation time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
 
//fprintf( pTable, "%d ", Cudd_SharingSize( pOutputs, nOutputs ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthSharingMax(dd, pOutputs, nOutputs) );

    // dispose of the multiple-output function
//  Extra_Dissolve( pFunc );
 
    // reorder the single output function
//    if ( fVerbose )
//  printf( "Reordering variables...\n");
    clk1 = Abc_Clock();
//  if ( fVerbose )
//  printf( "Node count before = %6d\n", Cudd_DagSize( aFunc ) );
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SIFT,1);
    Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
    Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
//  Cudd_ReduceHeap(dd, CUDD_REORDER_SYMM_SIFT,1);
    if ( fVerbose )
    printf( "MTBDD reordered = %6d nodes\n", Cudd_DagSize( aFunc ) );
    if ( fVerbose )
    printf( "Variable reordering time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
//  printf( "\n" );
//  printf( "Variable order is: " );
//  for ( i = 0; i < dd->size; i++ )
//      printf( " %d", dd->invperm[i] );
//  printf( "\n" );
//fprintf( pTable, "%d ", Cudd_DagSize( aFunc ) );
//fprintf( pTable, "%d ", Extra_ProfileWidthMax(dd, aFunc) );

    // write the single-output function into BLIF for verification
    clk1 = Abc_Clock();
    if ( fCheck )
    WriteSingleOutputFunctionBlif( dd, aFunc, pNames, nNames, FileNameIni );
//    if ( fVerbose )
//  printf( "Single-output function writing time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );

/*
    ///////////////////////////////////////////////////////////////////
    // verification of single output function
    clk1 = Abc_Clock();
    {
        BFunc g_Func;
        DdNode * aRes;

        g_Func.dd = dd;
        g_Func.FileInput = Extra_UtilStrsav(FileNameIni);

        if ( Extra_ReadFile( &g_Func ) == 0 )
        {
            printf( "\nSomething did not work out while reading the input file for verification\n");
            Extra_Dissolve( &g_Func );
            return;
        } 

        aRes = Cudd_BddToAdd( dd, g_Func.pOutputs[0] );  Cudd_Ref( aRes );

        if ( aRes != aFunc )
            printf( "\nVerification FAILED!\n");
        else
            printf( "\nVerification okay!\n");
        
        Cudd_RecursiveDeref( dd, aRes );

        // delocate
        Extra_Dissolve( &g_Func );
    }
    printf( "Preliminary verification time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    ///////////////////////////////////////////////////////////////////
*/

    if ( !CreateDecomposedNetwork( dd, aFunc, pNames, nNames, FileNameFin, nLutSize, fCheck, fVerbose ) )
        return 0;

/*
    ///////////////////////////////////////////////////////////////////
    // verification of the decomposed LUT network
    clk1 = Abc_Clock();
    {
        BFunc g_Func;
        DdNode * aRes;

        g_Func.dd = dd;
        g_Func.FileInput = Extra_UtilStrsav(FileNameFin);

        if ( Extra_ReadFile( &g_Func ) == 0 )
        {
            printf( "\nSomething did not work out while reading the input file for verification\n");
            Extra_Dissolve( &g_Func );
            return;
        } 

        aRes = Cudd_BddToAdd( dd, g_Func.pOutputs[0] );  Cudd_Ref( aRes );

        if ( aRes != aFunc )
            printf( "\nFinal verification FAILED!\n");
        else
            printf( "\nFinal verification okay!\n");
        
        Cudd_RecursiveDeref( dd, aRes );
 
        // delocate 
        Extra_Dissolve( &g_Func );
    }
    printf( "Final verification time = %.2f sec\n", (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC) );
    ///////////////////////////////////////////////////////////////////
*/
 
    // verify the results
    if ( fCheck )
    {
        char Command[300];
        sprintf( Command, "cec %s %s", FileNameIni, FileNameFin );
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
    }

    Cudd_RecursiveDeref( dd, aFunc );

    // release the names
    for ( i = 0; i < nNames; i++ )
        ABC_FREE( pNames[i] );


//fprintf( pTable, "\n" );
//fclose( pTable );

    return 1;
}